

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerLockingMode(Pager *pPager,int eMode)

{
  int iVar1;
  int eMode_local;
  Pager *pPager_local;
  
  if ((-1 < eMode) && (pPager->tempFile == '\0')) {
    iVar1 = sqlite3WalHeapMemory(pPager->pWal);
    if (iVar1 == 0) {
      pPager->exclusiveMode = (u8)eMode;
    }
  }
  return (int)pPager->exclusiveMode;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerLockingMode(Pager *pPager, int eMode){
  assert( eMode==PAGER_LOCKINGMODE_QUERY
            || eMode==PAGER_LOCKINGMODE_NORMAL
            || eMode==PAGER_LOCKINGMODE_EXCLUSIVE );
  assert( PAGER_LOCKINGMODE_QUERY<0 );
  assert( PAGER_LOCKINGMODE_NORMAL>=0 && PAGER_LOCKINGMODE_EXCLUSIVE>=0 );
  assert( pPager->exclusiveMode || 0==sqlite3WalHeapMemory(pPager->pWal) );
  if( eMode>=0 && !pPager->tempFile && !sqlite3WalHeapMemory(pPager->pWal) ){
    pPager->exclusiveMode = (u8)eMode;
  }
  return (int)pPager->exclusiveMode;
}